

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

void __thiscall
baryonyx::pnm_observer::pnm_observer(pnm_observer *this,string_view filename,int m,int n,long loop)

{
  details::pi_pnm_observer::pi_pnm_observer(&this->m_pi_obs,filename,m,n,loop);
  (this->m_ap_obs).constraints = m;
  (this->m_ap_obs).variables = n;
  (this->m_ap_obs).m_frame = 0;
  (this->m_ap_obs).m_basename._M_dataplus._M_p = (pointer)&(this->m_ap_obs).m_basename.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->m_ap_obs).m_basename,filename._M_str,
             filename._M_str + filename._M_len);
  return;
}

Assistant:

pnm_observer(const std::string_view filename, int m, int n, long int loop)
      : m_pi_obs(filename, m, n, loop)
      , m_ap_obs(filename, m, n, loop)
    {}